

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicBinding::Check(BasicBinding *this,GLenum e,GLuint expected)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  GLboolean local_39;
  bool status;
  double dStack_38;
  GLboolean b;
  GLdouble d;
  GLuint GStack_28;
  GLfloat f;
  GLint64 i64;
  GLuint local_18;
  GLint i;
  GLuint expected_local;
  GLenum e_local;
  BasicBinding *this_local;
  
  local_18 = expected;
  i = e;
  _expected_local = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,e,(GLint *)((long)&i64 + 4));
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,i,(GLint64 *)&GStack_28);
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,i,(GLfloat *)((long)&d + 4));
  glu::CallLogWrapper::glGetDoublev
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,i,&stack0xffffffffffffffc8);
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,i,&local_39);
  bVar2 = i64._4_4_ == local_18;
  bVar3 = GStack_28 == local_18;
  bVar4 = (GLuint)(long)d._4_4_ == local_18;
  bVar5 = (GLuint)(long)dStack_38 == local_18;
  bVar6 = (bool)local_39 == (local_18 != 0);
  if (!bVar6 || (!bVar5 || (!bVar4 || (!bVar3 || !bVar2)))) {
    pcVar1 = ShaderStorageBufferObjectBase::GLenumToString
                       (&this->super_ShaderStorageBufferObjectBase,i);
    anon_unknown_0::Output("%s is %d should be %d.\n",pcVar1,(ulong)i64._4_4_,(ulong)local_18);
  }
  return bVar6 && (bVar5 && (bVar4 && (bVar3 && bVar2)));
}

Assistant:

bool Check(GLenum e, GLuint expected)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLdouble  d;
		GLboolean b;

		glGetIntegerv(e, &i);
		glGetInteger64v(e, &i64);
		glGetFloatv(e, &f);
		glGetDoublev(e, &d);
		glGetBooleanv(e, &b);

		bool status = true;
		if (static_cast<GLuint>(i) != expected)
			status = false;
		if (static_cast<GLuint>(i64) != expected)
			status = false;
		if (static_cast<GLuint>(f) != expected)
			status = false;
		if (static_cast<GLuint>(d) != expected)
			status = false;
		if (b != (expected != 0 ? GL_TRUE : GL_FALSE))
			status = false;

		if (!status)
		{
			Output("%s is %d should be %d.\n", GLenumToString(e), i, expected);
		}
		return status;
	}